

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_dynamic_token_insert(lws *wsi,int hdr_len,int lws_hdr_index,char *arg,size_t len)

{
  lws_h2_netconn *plVar1;
  bool bVar2;
  lws *wsi_00;
  hpack_dynamic_table *dyn_00;
  char *pcVar3;
  uint16_t local_64;
  char *local_60;
  int local_4c;
  int local_44;
  int local_40;
  int n;
  int new_index;
  hpack_dynamic_table *dyn;
  size_t len_local;
  char *arg_local;
  int lws_hdr_index_local;
  int hdr_len_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  if ((wsi_00->h2).h2n == (lws_h2_netconn *)0x0) {
    wsi_local._4_4_ = 1;
  }
  else {
    plVar1 = (wsi_00->h2).h2n;
    dyn_00 = &plVar1->hpack_dyn_table;
    if (dyn_00->entries == (hpack_dt_entry *)0x0) {
      _lws_log(1,"%s: unsized dyn table\n","lws_dynamic_token_insert");
      wsi_local._4_4_ = 1;
    }
    else {
      lws_h2_dynamic_table_dump(wsi_00);
      if ((plVar1->hpack_dyn_table).num_entries == 0) {
        local_44 = 0;
      }
      else {
        local_44 = (int)((ulong)(plVar1->hpack_dyn_table).pos %
                        (ulong)(long)(int)(uint)(plVar1->hpack_dyn_table).num_entries);
      }
      if (((plVar1->hpack_dyn_table).num_entries != 0) &&
         ((plVar1->hpack_dyn_table).used_entries == (plVar1->hpack_dyn_table).num_entries)) {
        if ((plVar1->hpack_dyn_table).virtual_payload_usage <
            (plVar1->hpack_dyn_table).virtual_payload_max) {
          _lws_log(1,"Dropping header content before limit!\n");
        }
        lws_dynamic_free(dyn_00,local_44);
      }
      while( true ) {
        bVar2 = false;
        if (((plVar1->hpack_dyn_table).virtual_payload_usage != 0) &&
           (bVar2 = false, (plVar1->hpack_dyn_table).used_entries != 0)) {
          bVar2 = (ulong)((plVar1->hpack_dyn_table).virtual_payload_max + 0x400) <
                  ((plVar1->hpack_dyn_table).virtual_payload_usage + hdr_len) + len;
        }
        if (!bVar2) break;
        if ((plVar1->hpack_dyn_table).num_entries == 0) {
          local_4c = 0;
        }
        else {
          local_4c = (int)((uint)(plVar1->hpack_dyn_table).pos -
                          (uint)(plVar1->hpack_dyn_table).used_entries) %
                     (int)(uint)(plVar1->hpack_dyn_table).num_entries;
        }
        local_40 = local_4c;
        if (local_4c < 0) {
          local_40 = (uint)(plVar1->hpack_dyn_table).num_entries + local_4c;
        }
        lws_dynamic_free(dyn_00,local_40);
      }
      if ((plVar1->hpack_dyn_table).used_entries < (plVar1->hpack_dyn_table).num_entries) {
        (plVar1->hpack_dyn_table).used_entries = (plVar1->hpack_dyn_table).used_entries + 1;
      }
      dyn_00->entries[local_44].value_len = 0;
      if (lws_hdr_index == 0xffff) {
        dyn_00->entries[local_44].value = (char *)0x0;
      }
      else {
        if (dyn_00->entries[local_44].value != (char *)0x0) {
          lws_realloc(dyn_00->entries[local_44].value,0,"free");
          dyn_00->entries[local_44].value = (char *)0x0;
        }
        pcVar3 = (char *)lws_realloc((void *)0x0,len + 1,"hpack dyn");
        dyn_00->entries[local_44].value = pcVar3;
        if (dyn_00->entries[local_44].value == (char *)0x0) {
          return 1;
        }
        memcpy(dyn_00->entries[local_44].value,arg,len);
        dyn_00->entries[local_44].value[len] = '\0';
        dyn_00->entries[local_44].value_len = (uint16_t)len;
      }
      dyn_00->entries[local_44].lws_hdr_idx = (uint16_t)lws_hdr_index;
      dyn_00->entries[local_44].hdr_len = (uint16_t)hdr_len;
      (plVar1->hpack_dyn_table).virtual_payload_usage =
           (plVar1->hpack_dyn_table).virtual_payload_usage + hdr_len + (int)len;
      if (dyn_00->entries[local_44].value == (char *)0x0) {
        local_60 = "null";
      }
      else {
        local_60 = dyn_00->entries[local_44].value;
      }
      _lws_log(8,"%s: index %ld: lws_hdr_index 0x%x, hdr len %d, \'%s\' len %d\n",
               "lws_dynamic_token_insert",0x3e,(ulong)(uint)lws_hdr_index,(ulong)(uint)hdr_len,
               local_60,(int)len);
      if ((plVar1->hpack_dyn_table).num_entries == 0) {
        local_64 = 0;
      }
      else {
        local_64 = (uint16_t)
                   ((ulong)((plVar1->hpack_dyn_table).pos + 1) %
                   (ulong)(long)(int)(uint)(plVar1->hpack_dyn_table).num_entries);
      }
      (plVar1->hpack_dyn_table).pos = local_64;
      lws_h2_dynamic_table_dump(wsi_00);
      wsi_local._4_4_ = 0;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

static int
lws_dynamic_token_insert(struct lws *wsi, int hdr_len,
			 int lws_hdr_index, char *arg, size_t len)
{
	struct hpack_dynamic_table *dyn;
	int new_index;

	/* dynamic table only belongs to network wsi */
	wsi = lws_get_network_wsi(wsi);
	if (!wsi->h2.h2n)
		return 1;
	dyn = &wsi->h2.h2n->hpack_dyn_table;

	if (!dyn->entries) {
		lwsl_err("%s: unsized dyn table\n", __func__);

		return 1;
	}
	lws_h2_dynamic_table_dump(wsi);

	new_index = lws_safe_modulo(dyn->pos, dyn->num_entries);
	if (dyn->num_entries && dyn->used_entries == dyn->num_entries) {
		if (dyn->virtual_payload_usage < dyn->virtual_payload_max)
			lwsl_err("Dropping header content before limit!\n");
		/* we have to drop the oldest to make space */
		lws_dynamic_free(dyn, new_index);
	}

	/*
	 * evict guys to make room, allowing for some overage.  We have to
	 * take care about getting a single huge header, and evicting
	 * everything
	 */

	while (dyn->virtual_payload_usage &&
	       dyn->used_entries &&
	       dyn->virtual_payload_usage + (unsigned int)hdr_len + len >
				dyn->virtual_payload_max + 1024) {
		int n = lws_safe_modulo(dyn->pos - dyn->used_entries,
						dyn->num_entries);
		if (n < 0)
			n += dyn->num_entries;
		lws_dynamic_free(dyn, n);
	}

	if (dyn->used_entries < dyn->num_entries)
		dyn->used_entries++;

	dyn->entries[new_index].value_len = 0;

	if (lws_hdr_index != LWS_HPACK_IGNORE_ENTRY) {
		if (dyn->entries[new_index].value)
			lws_free_set_NULL(dyn->entries[new_index].value);
		dyn->entries[new_index].value =
				lws_malloc(len + 1, "hpack dyn");
		if (!dyn->entries[new_index].value)
			return 1;

		memcpy(dyn->entries[new_index].value, arg, len);
		dyn->entries[new_index].value[len] = '\0';
		dyn->entries[new_index].value_len = (uint16_t)len;
	} else
		dyn->entries[new_index].value = NULL;

	dyn->entries[new_index].lws_hdr_idx = (uint16_t)lws_hdr_index;
	dyn->entries[new_index].hdr_len = (uint16_t)hdr_len;

	dyn->virtual_payload_usage = (uint32_t)(dyn->virtual_payload_usage +
					(unsigned int)hdr_len + len);

	lwsl_info("%s: index %ld: lws_hdr_index 0x%x, hdr len %d, '%s' len %d\n",
		  __func__, (long)LWS_ARRAY_SIZE(static_token),
		  lws_hdr_index, hdr_len, dyn->entries[new_index].value ?
				 dyn->entries[new_index].value : "null", (int)len);

	dyn->pos = (uint16_t)lws_safe_modulo(dyn->pos + 1, dyn->num_entries);

	lws_h2_dynamic_table_dump(wsi);

	return 0;
}